

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attentional.h
# Opt level: O2

void __thiscall
dynet::AttentionalModel<dynet::LSTMBuilder>::display_tikz
          (AttentionalModel<dynet::LSTMBuilder> *this,vector<int,_std::allocator<int>_> *source,
          vector<int,_std::allocator<int>_> *target,ComputationGraph *cg,Expression *alignment,
          Dict *sd,Dict *td)

{
  undefined1 auVar1 [16];
  int iVar2;
  Tensor *pTVar3;
  ostream *poVar4;
  string *psVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint i;
  int iVar10;
  ulong uVar11;
  float fVar12;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar13 [16];
  undefined1 extraout_var [56];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qa_01;
  undefined8 extraout_XMM1_Qa_02;
  undefined8 extraout_XMM1_Qb;
  undefined8 extraout_XMM1_Qb_00;
  undefined8 extraout_XMM1_Qb_01;
  undefined8 extraout_XMM1_Qb_02;
  initializer_list<unsigned_int> x;
  uint local_70;
  uint local_68;
  int local_64;
  Tensor *local_60;
  uint local_58;
  Dim local_54;
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  local_58 = (alignment->i).t;
  uVar8 = (ulong)((long)(target->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(target->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  uVar11 = (ulong)((long)(source->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(source->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start) >> 2;
  pTVar3 = (Tensor *)dynet::ComputationGraph::get_value((VariableIndex)(uint)cg);
  auVar15._8_8_ = extraout_XMM1_Qb;
  auVar15._0_8_ = extraout_XMM1_Qa;
  auVar14._8_56_ = extraout_var;
  auVar14._0_8_ = extraout_XMM0_Qa;
  auVar13 = auVar14._0_16_;
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  poVar4 = std::operator<<(poVar4," x ");
  local_60 = pTVar3;
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::operator<<((ostream *)&std::cout,"\\begin{tikzpicture}[scale=0.5]\n");
  auVar13 = vcvtusi2sd_avx512f(auVar13,(int)uVar8);
  lVar6 = 0;
  for (uVar9 = 0; (uVar11 & 0xffffffff) != uVar9; uVar9 = uVar9 + 1) {
    std::operator<<((ostream *)&std::cout,"\\node[anchor=west,rotate=90] at (");
    auVar1 = vcvtusi2sd_avx512f(auVar15,(int)uVar9);
    poVar4 = std::ostream::_M_insert<double>(auVar1._0_8_ + 0.5);
    std::operator<<(poVar4,", ");
    poVar4 = std::ostream::_M_insert<double>(auVar13._0_8_ + 0.2);
    poVar4 = std::operator<<(poVar4,") { ");
    psVar5 = Dict::convert_abi_cxx11_
                       (sd,(int *)((long)(source->super__Vector_base<int,_std::allocator<int>_>).
                                         _M_impl.super__Vector_impl_data._M_start + lVar6));
    poVar4 = std::operator<<(poVar4,(string *)psVar5);
    std::operator<<(poVar4," };\n");
    lVar6 = lVar6 + 4;
  }
  local_70 = (uint)uVar11;
  auVar13 = vcvtusi2sd_avx512f(auVar15,local_70);
  uVar9 = uVar8 & 0xffffffff;
  for (lVar6 = 0; (uVar8 & 0xffffffff) << 2 != lVar6; lVar6 = lVar6 + 4) {
    std::operator<<((ostream *)&std::cout,"\\node[anchor=west] at (");
    poVar4 = std::ostream::_M_insert<double>(auVar13._0_8_ + 0.2);
    std::operator<<(poVar4,", ");
    auVar1 = vcvtusi2sd_avx512f(auVar15,(int)uVar9);
    poVar4 = std::ostream::_M_insert<double>(auVar1._0_8_ + -0.5);
    poVar4 = std::operator<<(poVar4,") { ");
    psVar5 = Dict::convert_abi_cxx11_
                       (td,(int *)((long)(target->super__Vector_base<int,_std::allocator<int>_>).
                                         _M_impl.super__Vector_impl_data._M_start + lVar6));
    poVar4 = std::operator<<(poVar4,(string *)psVar5);
    std::operator<<(poVar4," };\n");
    uVar9 = (ulong)((int)uVar9 - 1);
  }
  for (iVar10 = 0; iVar2 = (int)uVar8 - iVar10, iVar2 != 0; iVar10 = iVar10 + 1) {
    uVar7 = 0;
    auVar13 = vcvtusi2ss_avx512f(auVar15,iVar2 + -1);
    auVar1 = vcvtusi2ss_avx512f(auVar15,iVar2);
    while (local_70 != uVar7) {
      x._M_len = 2;
      x._M_array = &local_68;
      local_68 = uVar7;
      local_64 = iVar10;
      Dim::Dim(&local_54,x);
      fVar12 = (float)dynet::TensorTools::AccessElement(local_60,&local_54);
      poVar4 = std::operator<<((ostream *)&std::cout,"\\fill[blue!");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)(fVar12 * 100.0));
      auVar16._8_8_ = extraout_XMM1_Qb_00;
      auVar16._0_8_ = extraout_XMM1_Qa_00;
      poVar4 = std::operator<<(poVar4,"!black] (");
      auVar15 = vcvtusi2ss_avx512f(auVar16,uVar7);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,auVar15._0_4_ + 0.01);
      poVar4 = std::operator<<(poVar4,", ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,auVar13._0_4_ + 0.01);
      auVar17._8_8_ = extraout_XMM1_Qb_01;
      auVar17._0_8_ = extraout_XMM1_Qa_01;
      poVar4 = std::operator<<(poVar4,") rectangle (");
      uVar7 = uVar7 + 1;
      auVar15 = vcvtusi2ss_avx512f(auVar17,uVar7);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,auVar15._0_4_ + -0.01);
      poVar4 = std::operator<<(poVar4,",");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,auVar1._0_4_ + -0.01);
      auVar15._8_8_ = extraout_XMM1_Qb_02;
      auVar15._0_8_ = extraout_XMM1_Qa_02;
      std::operator<<(poVar4,");\n");
    }
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"\\draw[step=1cm,color=gray] (0,0) grid (");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4,", ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::operator<<(poVar4,");\n");
  std::operator<<((ostream *)&std::cout,"\\end{tikzpicture}\n");
  return;
}

Assistant:

void 
AttentionalModel<Builder>::display_tikz(const std::vector<int> &source, const std::vector<int>& target, 
                          ComputationGraph &cg, const Expression &alignment, Dict &sd, Dict &td)
{
    using namespace std;

    // display the alignment
    unsigned I = target.size();
    unsigned J = source.size();

    const Tensor &a = cg.get_value(alignment.i);
    cout << a.d[0] << " x " << a.d[1] << endl;

    cout << "\\begin{tikzpicture}[scale=0.5]\n";
    for (unsigned j = 0; j < J; ++j) 
        cout << "\\node[anchor=west,rotate=90] at (" << j+0.5 << ", " << I+0.2 << ") { " << sd.convert(source[j]) << " };\n";
    for (unsigned i = 0; i < I; ++i) 
        cout << "\\node[anchor=west] at (" << J+0.2 << ", " << I-i-0.5 << ") { " << td.convert(target[i]) << " };\n";

    float eps = 0.01;
    for (unsigned i = 0; i < I; ++i) {
        for (unsigned j = 0; j < J; ++j) {
            float v = TensorTools::AccessElement(a, Dim({(unsigned int)j, (unsigned int)i}));
            //int val = int(pow(v, 0.5) * 100);
            int val = int(v * 100);
            cout << "\\fill[blue!" << val << "!black] (" << j+eps << ", " << I-i-1+eps << ") rectangle (" << j+1-eps << "," << I-i-eps << ");\n";
        }
    }
    cout << "\\draw[step=1cm,color=gray] (0,0) grid (" << J << ", " << I << ");\n";
    cout << "\\end{tikzpicture}\n";
}